

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

void __thiscall cursespp::Window::RepaintBackground(Window *this)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x24])();
  if ((((this->drawFrame == true) && ((this->frameColor).value != -1)) &&
      (this->frame != (WINDOW *)0x0)) && (this->content != this->frame)) {
    werase();
    uVar2 = (ulong)((uVar1 & 0xff) << 4);
    wbkgdset(this->frame,*(undefined4 *)((long)&(this->frameColor).value + uVar2));
    wbkgd(this->frame,*(undefined4 *)((long)&(this->frameColor).value + uVar2));
    DrawFrameAndTitle(this);
  }
  if (this->content != (WINDOW *)0x0) {
    werase();
    uVar2 = (ulong)((uVar1 & 0xff) << 4);
    wbkgdset(this->content,*(undefined4 *)((long)&(this->contentColor).value + uVar2));
    wbkgd(this->content,*(undefined4 *)((long)&(this->contentColor).value + uVar2));
  }
  (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[4])(this);
  return;
}

Assistant:

void Window::RepaintBackground() {
    ASSERT_MAIN_THREAD();

    bool focused = IsFocused();

    if (this->drawFrame &&
        this->frameColor != Color::Default &&
        this->frame &&
        this->content != this->frame)
    {
        werase(this->frame);
        wbkgd_internal(this->frame, focused? this->focusedFrameColor : this->frameColor);
        this->DrawFrameAndTitle();
    }

    if (this->content) {
        werase(this->content);
        wbkgd_internal(this->content, focused ? this->focusedContentColor : this->contentColor);
    }

    this->Invalidate();
}